

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
Util::toString_abi_cxx11_(string *__return_storage_ptr__,Util *this,Anchor anchor)

{
  int src;
  allocator local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  stringstream str;
  
  src = (int)this;
  if (src == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"AnchorNone",(allocator *)&str);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    std::__cxx11::string::string((string *)&local_1b8,"AnchorBottom",&local_259);
    enumValueToString(src,2,&local_1b8,&str,false);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::string((string *)&local_1d8,"AnchorHeight",&local_259);
    enumValueToString(src,4,&local_1d8,&str,false);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string((string *)&local_1f8,"AnchorLeft",&local_259);
    enumValueToString(src,0x10,&local_1f8,&str,false);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::string((string *)&local_218,"AnchorRight",&local_259);
    enumValueToString(src,0x20,&local_218,&str,false);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::string((string *)&local_238,"AnchorTop",&local_259);
    enumValueToString(src,1,&local_238,&str,false);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::string((string *)&local_258,"AnchorWidth",&local_259);
    enumValueToString(src,0x40,&local_258,&str,true);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Util::toString(Anchor anchor)
{
	if (anchor == AnchorNone)
		return "AnchorNone";
	
	std::stringstream str;

	enumValueToString(anchor, AnchorBottom, "AnchorBottom", str);
	enumValueToString(anchor, AnchorHeight, "AnchorHeight", str);
	enumValueToString(anchor, AnchorLeft, "AnchorLeft", str);
	enumValueToString(anchor, AnchorRight, "AnchorRight", str);
	enumValueToString(anchor, AnchorTop, "AnchorTop", str);
	enumValueToString(anchor, AnchorWidth, "AnchorWidth", str, true);

	return str.str();
}